

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_i2c.c
# Opt level: O2

void csp_i2c_rx(csp_iface_t *iface,csp_packet_t *packet,void *pxTaskWoken)

{
  if (packet == (csp_packet_t *)0x0) {
    return;
  }
  if ((packet->field_0).field_1.frame_length < 4) {
    iface->frame = iface->frame + 1;
    if (pxTaskWoken != (void *)0x0) {
      csp_buffer_free_isr(packet);
      return;
    }
    csp_buffer_free(packet);
    return;
  }
  csp_id_strip(packet);
  csp_qfifo_write(packet,iface,pxTaskWoken);
  return;
}

Assistant:

void csp_i2c_rx(csp_iface_t * iface, csp_packet_t * packet, void * pxTaskWoken) {

	/* Validate input */
	if (packet == NULL) {
		return;
	}

	if (packet->frame_length < sizeof(uint32_t)) {
		iface->frame++;
		(pxTaskWoken != NULL) ? csp_buffer_free_isr(packet) : csp_buffer_free(packet);
		return;
	}

	/* We dont need to check for overflow, since this is already done at the driver level when inserting data into the buffer */

	/* Strip the CSP header off the length field before converting to CSP packet */
    csp_id_strip(packet);

	/* Receive the packet in CSP */
	csp_qfifo_write(packet, iface, pxTaskWoken);
}